

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O2

bool __thiscall
glcts::PipelineStatisticsQueryTestFunctional2::executeTest
          (PipelineStatisticsQueryTestFunctional2 *this,GLenum current_query_target)

{
  ostringstream *poVar1;
  Context *pCVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  GLenum value;
  undefined **ppuVar6;
  long lVar7;
  GLuint64 expected_value;
  undefined1 local_1f0 [384];
  _test_execution_result run_result;
  
  run_result.result_qo_int = 0x7fffffff;
  run_result.result_qo_int64 = 0x7fffffffffffffff;
  run_result.result_qo_uint = 0xffffffff;
  run_result.result_qo_uint64 = 0xffffffffffffffff;
  run_result.result_int = 0x7fffffff;
  run_result.result_int64 = 0x7fffffffffffffff;
  run_result.result_uint = 0xffffffff;
  run_result.result_uint64 = 0xffffffffffffffff;
  run_result.int64_written = false;
  run_result.uint64_written = false;
  bVar3 = true;
  ppuVar6 = &PTR_executeBlitFramebufferTest_01ddb3a0;
  lVar7 = 0;
  do {
    if (lVar7 == 0xc) {
      return bVar3;
    }
    cVar4 = (*(code *)*ppuVar6)(this);
    if (cVar4 != '\0') {
      pCVar2 = (this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.m_context;
      bVar5 = PipelineStatisticsQueryUtilities::executeQuery
                        (current_query_target,
                         (this->super_PipelineStatisticsQueryTestFunctionalBase).m_qo_id,
                         (this->super_PipelineStatisticsQueryTestFunctionalBase).m_bo_qo_id,
                         (PFNQUERYDRAWHANDLERPROC)0x0,(void *)0x0,pCVar2->m_renderCtx,
                         (this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.
                         super_TestCase.super_TestNode.m_testCtx,pCVar2->m_contextInfo,&run_result);
      if (bVar5) {
        expected_value = 0;
        bVar5 = PipelineStatisticsQueryUtilities::verifyResultValues
                          (&run_result,1,&expected_value,
                           (this->super_PipelineStatisticsQueryTestFunctionalBase).m_qo_id != 0,
                           current_query_target,(_draw_call_type *)0x0,(_primitive_type *)0x0,false,
                           (this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.
                           super_TestCase.super_TestNode.m_testCtx,VERIFICATION_TYPE_EXACT_MATCH);
        poVar1 = (ostringstream *)(local_1f0 + 8);
        if (bVar5) goto LAB_00ac38dc;
        local_1f0._0_8_ =
             ((this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.super_TestCase.
              super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Test failed for iteration index [");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1,"].");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_1f0._0_8_ =
             ((this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.super_TestCase.
              super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1f0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Query execution failed for query target [");
        PipelineStatisticsQueryUtilities::getStringForEnum_abi_cxx11_
                  ((string *)&expected_value,
                   (PipelineStatisticsQueryUtilities *)(ulong)current_query_target,value);
        std::operator<<((ostream *)poVar1,(string *)&expected_value);
        std::operator<<((ostream *)poVar1,"]");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&expected_value);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1f0 + 8));
      bVar3 = false;
    }
LAB_00ac38dc:
    lVar7 = lVar7 + 1;
    ppuVar6 = ppuVar6 + 1;
  } while( true );
}

Assistant:

bool PipelineStatisticsQueryTestFunctional2::executeTest(glw::GLenum current_query_target)
{
	bool															result = true;
	PipelineStatisticsQueryUtilities::_test_execution_result		run_result;
	const PipelineStatisticsQueryUtilities::PFNQUERYDRAWHANDLERPROC query_draw_handlers[] = {
		executeBlitFramebufferTest,
		executeBufferSubDataTest,
		executeClearBufferfvColorBufferTest,
		executeClearBufferfvDepthBufferTest,
		executeClearBufferivStencilBufferTest,
		executeClearBufferSubDataTest,
		executeClearColorBufferTest,
		executeClearDepthBufferTest,
		executeClearStencilBufferTest,
		executeClearTexSubImageTest,
		executeCopyImageSubDataTest,
		executeTexSubImageTest,
	};
	const unsigned int n_query_draw_handlers = sizeof(query_draw_handlers) / sizeof(query_draw_handlers[0]);

	for (unsigned int n = 0; n < n_query_draw_handlers; ++n)
	{
		const PipelineStatisticsQueryUtilities::PFNQUERYDRAWHANDLERPROC& draw_handler_pfn = query_draw_handlers[n];

		/* Query executors can return false if a given test cannot be executed, given
		 * work environment constraint (eg. insufficient GL version). In case of an error,
		 * they will throw an exception.
		 */
		if (draw_handler_pfn(this))
		{
			if (!PipelineStatisticsQueryUtilities::executeQuery(
					current_query_target, m_qo_id, m_bo_qo_id, DE_NULL, /* pfn_draw */
					DE_NULL,											/* draw_user_arg */
					m_context.getRenderContext(), m_testCtx, m_context.getContextInfo(), &run_result))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Query execution failed for query target "
															   "["
								   << PipelineStatisticsQueryUtilities::getStringForEnum(current_query_target) << "]"
								   << tcu::TestLog::EndMessage;

				result = false;
			}
			else
			{
				const glw::GLuint64 expected_value = 0;
				bool				has_passed	 = true;

				has_passed = PipelineStatisticsQueryUtilities::verifyResultValues(
					run_result, 1, &expected_value, m_qo_id != 0,  /* should_check_qo_bo_values */
					current_query_target, DE_NULL, DE_NULL, false, /* is_primitive_restart_enabled */
					m_testCtx, PipelineStatisticsQueryUtilities::VERIFICATION_TYPE_EXACT_MATCH);

				if (!has_passed)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Test failed for iteration index [" << n << "]."
									   << tcu::TestLog::EndMessage;

					result = false;
				}
			} /* if (run results were obtained successfully) */
		}	 /* if (draw handler executed successfully) */
	}

	return result;
}